

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

ptrdiff_t __thiscall
google::protobuf::io::EpsCopyOutputStream::GetSize(EpsCopyOutputStream *this,uint8_t *ptr)

{
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  uint8_t *local_18;
  uint8_t *ptr_local;
  EpsCopyOutputStream *this_local;
  
  local_51 = 0;
  local_18 = ptr;
  ptr_local = (uint8_t *)this;
  if (this->end_ + 0x10 < ptr) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x358);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: ptr <= end_ + kSlopBytes: ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (ptrdiff_t)(this->end_ + (0x10 - (long)local_18));
}

Assistant:

std::ptrdiff_t GetSize(uint8_t* ptr) const {
    GOOGLE_DCHECK(ptr <= end_ + kSlopBytes);  // NOLINT
    return end_ + kSlopBytes - ptr;
  }